

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O0

string * __thiscall
RegistryValue::DwordAsString_abi_cxx11_(string *__return_storage_ptr__,RegistryValue *this)

{
  uint32_t uVar1;
  string *__return_storage_ptr___00;
  size_type sVar2;
  const_iterator p;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  RegistryValue *local_18;
  RegistryValue *this_local;
  
  local_18 = this;
  this_local = (RegistryValue *)__return_storage_ptr__;
  if (this->m_dwType != 4) {
    __return_storage_ptr___00 = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (__return_storage_ptr___00,"DwordAsString: not a dword: %d",(ulong)this->m_dwType);
    __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                std::__cxx11::string::~string);
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
  if (sVar2 == 0) {
    stringformat_abi_cxx11_(__return_storage_ptr__,"dword:");
  }
  else {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
    if (sVar2 == 4) {
      p = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_data);
      uVar1 = get32le<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )p._M_current);
      stringformat_abi_cxx11_(__return_storage_ptr__,"dword:%08lx",(ulong)uVar1);
    }
    else {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_data);
      stringformat_abi_cxx11_(&local_48,"DwordAsString: invalid sized dword: %d",sVar2);
      warn(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      stringformat_abi_cxx11_(&local_68,"hex(%d):",(ulong)this->m_dwType);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
      ascdump<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_88,&this->m_data,&local_a8,false);
      std::operator+(__return_storage_ptr__,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DwordAsString() const
    {
            if (m_dwType!=REG_DWORD) throw stringformat("DwordAsString: not a dword: %d", m_dwType);
            if (m_data.size()==0)
                    return stringformat("dword:");
            else if (m_data.size()!=sizeof(uint32_t)) {
        warn(stringformat("DwordAsString: invalid sized dword: %d", m_data.size()));
                    return stringformat("hex(%d):", m_dwType)+ascdump(m_data);
            }
            return stringformat("dword:%08lx", get32le(m_data.begin()));
    }